

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::setViewMode(QMdiAreaPrivate *this,ViewMode mode)

{
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  Shape shape;
  QMdiAreaTabBar *pQVar5;
  qsizetype qVar6;
  QWidget *pQVar7;
  long lVar8;
  QMdiSubWindow *subWindow;
  long in_FS_OFFSET;
  QMdiSubWindow *current;
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QString local_78;
  undefined1 local_60 [8];
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->viewMode != mode) && (this->inViewModeChange == false)) {
    pQVar7 = *(QWidget **)
              &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
               field_0x8;
    this->inViewModeChange = true;
    if (mode == TabbedView) {
      pQVar5 = (QMdiAreaTabBar *)operator_new(0x28);
      QTabBar::QTabBar((QTabBar *)pQVar5,pQVar7);
      *(undefined ***)&(pQVar5->super_QTabBar).super_QWidget = &PTR_metaObject_00803d50;
      *(undefined ***)&(pQVar5->super_QTabBar).super_QWidget.super_QPaintDevice =
           &PTR__QMdiAreaTabBar_00803f30;
      this->tabBar = pQVar5;
      QTabBar::setDocumentMode((QTabBar *)pQVar5,this->documentMode);
      QTabBar::setTabsClosable(&this->tabBar->super_QTabBar,this->tabsClosable);
      QTabBar::setMovable(&this->tabBar->super_QTabBar,this->tabsMovable);
      pQVar5 = this->tabBar;
      shape = _q_tb_tabBarShapeFrom(this->tabShape,this->tabPosition);
      QTabBar::setShape(&pQVar5->super_QTabBar,shape);
      this->isSubWindowsTiled = false;
      local_58.d = (this->childWindows).d.d;
      pQVar1 = (this->childWindows).d.ptr;
      local_58.size = (this->childWindows).d.size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_58.ptr = pQVar1;
      if (local_58.size != 0) {
        lVar2 = local_58.size << 4;
        lVar8 = 0;
        do {
          lVar3 = *(long *)((long)&(pQVar1->wp).d + lVar8);
          if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
            subWindow = (QMdiSubWindow *)0x0;
          }
          else {
            subWindow = *(QMdiSubWindow **)((long)&(pQVar1->wp).value + lVar8);
          }
          pQVar5 = this->tabBar;
          QWidget::windowIcon((QWidget *)local_60);
          tabTextFor(&local_78,subWindow);
          QTabBar::addTab(&pQVar5->super_QTabBar,(QIcon *)local_60,&local_78);
          if ((QWidget *)local_78.d.d != (QWidget *)0x0) {
            LOCK();
            *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
            UNLOCK();
            if (*(int *)local_78.d.d == 0) {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          QIcon::~QIcon((QIcon *)local_60);
          lVar8 = lVar8 + 0x10;
        } while (lVar2 != lVar8);
      }
      local_78.d.d = (Data *)QMdiArea::currentSubWindow((QMdiArea *)pQVar7);
      if ((QWidget *)local_78.d.d == (QWidget *)0x0) {
        this->viewMode = TabbedView;
      }
      else {
        pQVar5 = this->tabBar;
        qVar6 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                          (&this->childWindows,(QMdiSubWindow **)&local_78,0);
        QTabBar::setCurrentIndex(&pQVar5->super_QTabBar,(int)qVar6);
        bVar4 = QWidget::isMaximized((QWidget *)local_78.d.d);
        if (bVar4) {
          QWidget::showNormal((QWidget *)local_78.d.d);
        }
        this->viewMode = TabbedView;
        if ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x3b4) & 1) == 0) {
          QWidget::showMaximized((QWidget *)local_78.d.d);
        }
      }
      if ((pQVar7->data->widget_attributes & 0x8000) != 0) {
        QWidget::show((QWidget *)this->tabBar);
      }
      updateTabBarGeometry(this);
      QObject::connect(local_80,(char *)this->tabBar,(QObject *)"2currentChanged(int)",
                       (char *)pQVar7,0x6e959b);
      QMetaObject::Connection::~Connection((Connection *)local_80);
      QObject::connect(local_88,(char *)this->tabBar,(QObject *)"2tabCloseRequested(int)",
                       (char *)pQVar7,0x6e95ce);
      QMetaObject::Connection::~Connection((Connection *)local_88);
      QObject::connect(local_90,(char *)this->tabBar,(QObject *)"2tabMoved(int,int)",(char *)pQVar7,
                       0x6e95f3);
      QMetaObject::Connection::~Connection((Connection *)local_90);
      QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_58);
    }
    else {
      if (this->tabBar != (QMdiAreaTabBar *)0x0) {
        (**(code **)(*(long *)&(this->tabBar->super_QTabBar).super_QWidget + 0x20))();
      }
      this->tabBar = (QMdiAreaTabBar *)0x0;
      this->viewMode = mode;
      QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)pQVar7,0,0,0,0);
      this->indexToLastActiveTab = -1;
      pQVar7 = &QMdiArea::currentSubWindow((QMdiArea *)pQVar7)->super_QWidget;
      if (pQVar7 != (QWidget *)0x0) {
        bVar4 = QWidget::isMaximized(pQVar7);
        if (bVar4) {
          QWidget::showNormal(pQVar7);
        }
      }
    }
    this->inViewModeChange = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::setViewMode(QMdiArea::ViewMode mode)
{
    Q_Q(QMdiArea);
    if (viewMode == mode || inViewModeChange)
        return;

    // Just a guard since we cannot set viewMode = mode here.
    inViewModeChange = true;

#if QT_CONFIG(tabbar)
    if (mode == QMdiArea::TabbedView) {
        Q_ASSERT(!tabBar);
        tabBar = new QMdiAreaTabBar(q);
        tabBar->setDocumentMode(documentMode);
        tabBar->setTabsClosable(tabsClosable);
        tabBar->setMovable(tabsMovable);
#if QT_CONFIG(tabwidget)
        tabBar->setShape(_q_tb_tabBarShapeFrom(tabShape, tabPosition));
#endif

        isSubWindowsTiled = false;

        // Take a copy as tabBar->addTab() will (indirectly) create a connection between
        // the tab close button clicked() signal and the _q_closeTab() slot, which may
        // indirectly call QCoreApplication::sendEvent(), the latter could result in
        // invoking unknown code that could e.g. recurse into the class modifying childWindows.
        const auto subWindows = childWindows;
        for (QMdiSubWindow *subWindow : subWindows)
            tabBar->addTab(subWindow->windowIcon(), tabTextFor(subWindow));

        QMdiSubWindow *current = q->currentSubWindow();
        if (current) {
            tabBar->setCurrentIndex(childWindows.indexOf(current));
            // Restore sub-window (i.e. cleanup buttons in menu bar and window title).
            if (current->isMaximized())
                current->showNormal();

            viewMode = mode;

            // Now, maximize it.
            if (!q->testOption(QMdiArea::DontMaximizeSubWindowOnActivation)) {
                current->showMaximized();
            }
        } else {
            viewMode = mode;
        }

        if (q->isVisible())
            tabBar->show();
        updateTabBarGeometry();

        QObject::connect(tabBar, SIGNAL(currentChanged(int)), q, SLOT(_q_currentTabChanged(int)));
        QObject::connect(tabBar, SIGNAL(tabCloseRequested(int)), q, SLOT(_q_closeTab(int)));
        QObject::connect(tabBar, SIGNAL(tabMoved(int,int)), q, SLOT(_q_moveTab(int,int)));
    } else
#endif // QT_CONFIG(tabbar)
    { // SubWindowView
#if QT_CONFIG(tabbar)
        delete tabBar;
        tabBar = nullptr;
#endif // QT_CONFIG(tabbar)

        viewMode = mode;
        q->setViewportMargins(0, 0, 0, 0);
        indexToLastActiveTab = -1;

        QMdiSubWindow *current = q->currentSubWindow();
        if (current && current->isMaximized())
            current->showNormal();
    }

    Q_ASSERT(viewMode == mode);
    inViewModeChange = false;
}